

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O3

int __thiscall
cmsys::SystemInformationImplementation::GetFullyQualifiedDomainName
          (SystemInformationImplementation *this,string *fqdn)

{
  ushort uVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  long *plVar8;
  socklen_t __salen;
  int iVar9;
  bool bVar10;
  ifaddrs *ifas;
  string candidate;
  char base [1025];
  char host [1025];
  long *local_870;
  long *local_868;
  ulong local_860;
  long local_858 [2];
  char local_848 [1040];
  char local_438 [1032];
  
  std::__cxx11::string::_M_replace((ulong)fqdn,0,(char *)fqdn->_M_string_length,0x4ecff0);
  iVar3 = gethostname(local_848,0x401);
  iVar4 = -1;
  if (iVar3 == 0) {
    sVar5 = strlen(local_848);
    pcVar2 = (char *)fqdn->_M_string_length;
    strlen(local_848);
    iVar9 = 0;
    std::__cxx11::string::_M_replace((ulong)fqdn,0,pcVar2,(ulong)local_848);
    iVar3 = getifaddrs(&local_870);
    iVar4 = -2;
    if (iVar3 == 0) {
      if (local_870 != (long *)0x0) {
        iVar9 = 0;
        plVar8 = local_870;
        do {
          iVar4 = iVar9;
          if (((ushort *)plVar8[3] != (ushort *)0x0) &&
             (uVar1 = *(ushort *)plVar8[3], (uVar1 | 8) == 10)) {
            memset(local_438,0,0x401);
            __salen = 0x1c;
            if (uVar1 == 2) {
              __salen = 0x10;
            }
            iVar4 = getnameinfo((sockaddr *)plVar8[3],__salen,local_438,0x401,(char *)0x0,0,8);
            if (iVar4 == 0) {
              local_868 = local_858;
              sVar6 = strlen(local_438);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_868,local_438,local_438 + sVar6);
              strlen(local_848);
              lVar7 = std::__cxx11::string::find((char *)&local_868,(ulong)local_848,0);
              bVar10 = sVar5 < local_860;
              if (bVar10 && lVar7 != -1) {
                std::__cxx11::string::_M_assign((string *)fqdn);
              }
              if (local_868 != local_858) {
                operator_delete(local_868,local_858[0] + 1);
              }
              iVar9 = 0;
              iVar4 = 0;
              if (bVar10 && lVar7 != -1) break;
            }
            else {
              iVar4 = -3;
            }
          }
          iVar9 = iVar4;
          plVar8 = (long *)*plVar8;
        } while (plVar8 != (long *)0x0);
      }
      freeifaddrs(local_870);
      iVar4 = iVar9;
    }
  }
  return iVar4;
}

Assistant:

int SystemInformationImplementation::GetFullyQualifiedDomainName(
      std::string &fqdn)
{
  // in the event of absolute failure return localhost.
  fqdn="localhost";

#if defined(_WIN32)
  int ierr;
  // TODO - a more robust implementation for windows, see comments
  // in unix implementation.
  WSADATA wsaData;
  WORD ver=MAKEWORD(2,0);
  ierr=WSAStartup(ver,&wsaData);
  if (ierr)
    {
    return -1;
    }

  char base[256]={'\0'};
  ierr=gethostname(base,256);
  if (ierr)
    {
    WSACleanup();
    return -2;
    }
  fqdn=base;

  HOSTENT *hent=gethostbyname(base);
  if (hent)
    {
    fqdn=hent->h_name;
    }

  WSACleanup();
  return 0;

#elif defined(KWSYS_SYSTEMINFORMATION_IMPLEMENT_FQDN)
  // gethostname typical returns an alias for loopback interface
  // we want the fully qualified domain name. Because there are
  // any number of interfaces on this system we look for the
  // first of these that contains the name returned by gethostname
  // and is longer. failing that we return gethostname and indicate
  // with a failure code. Return of a failure code is not necessarilly
  // an indication of an error. for instance gethostname may return
  // the fully qualified domain name, or there may not be one if the
  // system lives on a private network such as in the case of a cluster
  // node.

  int ierr=0;
  char base[NI_MAXHOST];
  ierr=gethostname(base,NI_MAXHOST);
  if (ierr)
    {
    return -1;
    }
  size_t baseSize=strlen(base);
  fqdn=base;

  struct ifaddrs *ifas;
  struct ifaddrs *ifa;
  ierr=getifaddrs(&ifas);
  if (ierr)
    {
    return -2;
    }

  for (ifa=ifas; ifa!=NULL; ifa=ifa->ifa_next)
    {
    int fam = ifa->ifa_addr? ifa->ifa_addr->sa_family : -1;
    if ((fam==AF_INET) || (fam==AF_INET6))
      {
      char host[NI_MAXHOST]={'\0'};

      const size_t addrlen
        = (fam==AF_INET?sizeof(struct sockaddr_in):sizeof(struct sockaddr_in6));

      ierr=getnameinfo(
            ifa->ifa_addr,
            static_cast<socklen_t>(addrlen),
            host,
            NI_MAXHOST,
            NULL,
            0,
            NI_NAMEREQD);
      if (ierr)
        {
        // don't report the failure now since we may succeed on another
        // interface. If all attempts fail then return the failure code.
        ierr=-3;
        continue;
        }

      std::string candidate=host;
      if ((candidate.find(base)!=std::string::npos) && baseSize<candidate.size())
        {
        // success, stop now.
        ierr=0;
        fqdn=candidate;
        break;
        }
      }
    }
  freeifaddrs(ifas);

  return ierr;
#else
  /* TODO: Implement on more platforms.  */
  fqdn=this->GetHostname();
  return -1;
#endif
}